

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtmem.cpp
# Opt level: O3

Error asmjit::v1_14::VirtMem::mapMemory
                (void **p,size_t size,MemoryFlags memoryFlags,int fd,off_t offset)

{
  long lVar1;
  MemoryFlags __prot;
  Error EVar2;
  void *__addr;
  int *piVar3;
  __atomic_base<unsigned_long> _Var4;
  MemoryFlags MVar5;
  int __flags;
  
  *p = (void *)0x0;
  if (size == 0) {
    return 2;
  }
  MVar5 = kAccessRW;
  if ((memoryFlags & kAccessWrite) == kNone) {
    MVar5 = memoryFlags & kAccessRead;
  }
  __prot = MVar5 | kAccessRX;
  if ((memoryFlags & kAccessExecute) == kNone) {
    __prot = MVar5;
  }
  __flags = (uint)((memoryFlags >> 8 & 1) == 0) + (uint)(fd == -1) * 0x20 + 1;
  if ((memoryFlags >> 9 & 1) == 0) {
    __addr = mmap((void *)0x0,size,__prot,__flags,fd,0);
    if (__addr == (void *)0xffffffffffffffff) {
LAB_00129d51:
      piVar3 = __errno_location();
      EVar2 = asmjitErrorFromErrno(*piVar3);
      return EVar2;
    }
  }
  else {
    _Var4 = largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i;
    if ((ulong)largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i < 2) {
      if (largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i == 1) {
        return 7;
      }
      _Var4._M_i = detectLargePageSize();
      largePageSize::largePageSize.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(_Var4._M_i + (_Var4._M_i == 0));
      LOCK();
      UNLOCK();
      if (_Var4._M_i == 0) {
        return 7;
      }
    }
    if (size % _Var4._M_i != 0) {
      return 2;
    }
    lVar1 = 0;
    if (_Var4._M_i != 0) {
      for (; (_Var4._M_i >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    __addr = mmap((void *)0x0,size,__prot,(int)lVar1 * 0x4000000 + __flags + 0x40000,fd,0);
    if (__addr == (void *)0xffffffffffffffff) goto LAB_00129d51;
    madvise(__addr,size,0xe);
  }
  *p = __addr;
  return 0;
}

Assistant:

static Error mapMemory(void** p, size_t size, MemoryFlags memoryFlags, int fd = -1, off_t offset = 0) noexcept {
  *p = nullptr;
  if (size == 0)
    return DebugUtils::errored(kErrorInvalidArgument);

  int protection = mmProtFromMemoryFlags(memoryFlags) | mmMaxProtFromMemoryFlags(memoryFlags);
  int mmFlags = mmMapJitFromMemoryFlags(memoryFlags);

  mmFlags |= Support::test(memoryFlags, MemoryFlags::kMapShared) ? MAP_SHARED : MAP_PRIVATE;
  if (fd == -1)
    mmFlags |= MAP_ANONYMOUS;

  bool useLargePages = Support::test(memoryFlags, VirtMem::MemoryFlags::kMMapLargePages);

  if (useLargePages) {
#if defined(__linux__)
    size_t lpSize = largePageSize();
    if (lpSize == 0)
      return DebugUtils::errored(kErrorFeatureNotEnabled);

    if (!Support::isAligned(size, lpSize))
      return DebugUtils::errored(kErrorInvalidArgument);

    unsigned lpSizeLog2 = Support::ctz(lpSize);
    mmFlags |= int(unsigned(MAP_HUGETLB) | (lpSizeLog2 << MAP_HUGE_SHIFT));
#else
    return DebugUtils::errored(kErrorFeatureNotEnabled);
#endif // __linux__
  }

  void* ptr = mmap(nullptr, size, protection, mmFlags, fd, offset);
  if (ptr == MAP_FAILED)
    return DebugUtils::errored(asmjitErrorFromErrno(errno));

#if defined(MADV_HUGEPAGE)
  if (useLargePages) {
    madvise(ptr, size, MADV_HUGEPAGE);
  }
#endif

  *p = ptr;
  return kErrorOk;
}